

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  undefined8 uVar2;
  Geometry *this;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  long lVar13;
  byte bVar14;
  size_t i;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar29;
  float fVar30;
  undefined1 auVar26 [16];
  float fVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar32;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar38;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1058 [6];
  long local_1040;
  long local_1038;
  ulong local_1030;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [8];
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [8];
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  fVar50 = (query->p).field_0.field_0.x;
  fVar54 = (query->p).field_0.field_0.y;
  fVar58 = (query->p).field_0.field_0.z;
  fVar65 = (context->query_radius).field_0.m128[0];
  fVar62 = (context->query_radius).field_0.m128[1];
  fVar63 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar49 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    auVar49 = dpps((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  }
  pauVar10 = (undefined1 (*) [16])local_f68;
  bVar7 = false;
  local_f98 = fVar50;
  fStack_f94 = fVar50;
  fStack_f90 = fVar50;
  fStack_f8c = fVar50;
  local_fa8 = fVar54;
  fStack_fa4 = fVar54;
  fStack_fa0 = fVar54;
  fStack_f9c = fVar54;
  local_fb8 = fVar58;
  fStack_fb4 = fVar58;
  fStack_fb0 = fVar58;
  fStack_fac = fVar58;
  fVar51 = fVar50;
  fVar52 = fVar50;
  fVar53 = fVar50;
  fVar55 = fVar54;
  fVar56 = fVar54;
  fVar57 = fVar54;
  fVar59 = fVar58;
  fVar60 = fVar58;
  fVar61 = fVar58;
  do {
    local_fe8 = fVar50 - fVar65;
    fStack_fe4 = fVar51 - fVar65;
    fStack_fe0 = fVar52 - fVar65;
    fStack_fdc = fVar53 - fVar65;
    local_ff8 = fVar50 + fVar65;
    fStack_ff4 = fVar51 + fVar65;
    fStack_ff0 = fVar52 + fVar65;
    fStack_fec = fVar53 + fVar65;
    local_1008._0_4_ = fVar54 - fVar62;
    local_1008._4_4_ = fVar55 - fVar62;
    fStack_1000 = fVar56 - fVar62;
    fStack_ffc = fVar57 - fVar62;
    local_fc8 = fVar62 + fVar54;
    fStack_fc4 = fVar62 + fVar55;
    fStack_fc0 = fVar62 + fVar56;
    fStack_fbc = fVar62 + fVar57;
    local_1018 = fVar58 - fVar63;
    fStack_1014 = fVar59 - fVar63;
    fStack_1010 = fVar60 - fVar63;
    fStack_100c = fVar61 - fVar63;
    local_fd8._0_4_ = fVar63 + fVar58;
    local_fd8._4_4_ = fVar63 + fVar59;
    fStack_fd0 = fVar63 + fVar60;
    fStack_fcc = fVar63 + fVar61;
    fVar62 = fVar65 * fVar65;
    fVar63 = fVar65 * fVar65;
    fVar64 = fVar65 * fVar65;
    fVar65 = fVar65 * fVar65;
    local_1028 = auVar49;
    local_f88 = fVar62;
    fStack_f84 = fVar63;
    fStack_f80 = fVar64;
    fStack_f7c = fVar65;
LAB_0068510b:
    do {
      do {
        if (pauVar10 == (undefined1 (*) [16])&local_f78) {
          return bVar7;
        }
        pauVar9 = pauVar10 + -1;
        pauVar10 = pauVar10 + -1;
      } while (auVar49._0_4_ < *(float *)((long)*pauVar9 + 8));
      pauVar9 = (undefined1 (*) [16])&local_f78;
      pauVar11 = *(undefined1 (**) [16])*pauVar10;
LAB_00685130:
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if (((ulong)pauVar11 & 8) != 0) goto LAB_0068543f;
        auVar49 = pauVar11[6];
        auVar24 = pauVar11[2];
        auVar28 = pauVar11[3];
        auVar26 = pauVar11[4];
        auVar40 = pauVar11[5];
        auVar45 = pauVar11[7];
        auVar46._4_4_ = fVar51;
        auVar46._0_4_ = fVar50;
        auVar46._8_4_ = fVar52;
        auVar46._12_4_ = fVar53;
        auVar46 = maxps(auVar46,auVar24);
        auVar46 = minps(auVar46,auVar28);
        fVar25 = auVar46._0_4_ - fVar50;
        fVar30 = auVar46._4_4_ - fVar51;
        fVar32 = auVar46._8_4_ - fVar52;
        fVar36 = auVar46._12_4_ - fVar53;
        auVar48._4_4_ = fVar55;
        auVar48._0_4_ = fVar54;
        auVar48._8_4_ = fVar56;
        auVar48._12_4_ = fVar57;
        auVar46 = maxps(auVar48,auVar26);
        auVar46 = minps(auVar46,auVar40);
        fVar38 = auVar46._0_4_ - fVar54;
        fVar41 = auVar46._4_4_ - fVar55;
        fVar42 = auVar46._8_4_ - fVar56;
        fVar43 = auVar46._12_4_ - fVar57;
        auVar47._4_4_ = fVar59;
        auVar47._0_4_ = fVar58;
        auVar47._8_4_ = fVar60;
        auVar47._12_4_ = fVar61;
        auVar46 = maxps(auVar47,auVar49);
        auVar46 = minps(auVar46,auVar45);
        fVar29 = auVar46._0_4_ - fVar58;
        fVar31 = auVar46._4_4_ - fVar59;
        fVar35 = auVar46._8_4_ - fVar60;
        fVar37 = auVar46._12_4_ - fVar61;
        local_1058[0] = fVar29 * fVar29 + fVar38 * fVar38 + fVar25 * fVar25;
        local_1058[1] = fVar31 * fVar31 + fVar41 * fVar41 + fVar30 * fVar30;
        local_1058[2] = fVar35 * fVar35 + fVar42 * fVar42 + fVar32 * fVar32;
        local_1058[3] = fVar37 * fVar37 + fVar43 * fVar43 + fVar36 * fVar36;
        bVar4 = ((auVar49._0_4_ <= (float)local_fd8._0_4_ && local_fe8 <= auVar28._0_4_) &&
                (auVar26._0_4_ <= local_fc8 && auVar24._0_4_ <= local_ff8)) &&
                (local_1018 <= auVar45._0_4_ &&
                ((float)local_1008._0_4_ <= auVar40._0_4_ && auVar24._0_4_ <= auVar28._0_4_));
        bVar5 = ((auVar49._4_4_ <= (float)local_fd8._4_4_ && fStack_fe4 <= auVar28._4_4_) &&
                (auVar26._4_4_ <= fStack_fc4 && auVar24._4_4_ <= fStack_ff4)) &&
                (fStack_1014 <= auVar45._4_4_ &&
                ((float)local_1008._4_4_ <= auVar40._4_4_ && auVar24._4_4_ <= auVar28._4_4_));
        bVar3 = ((auVar49._8_4_ <= fStack_fd0 && fStack_fe0 <= auVar28._8_4_) &&
                (auVar26._8_4_ <= fStack_fc0 && auVar24._8_4_ <= fStack_ff0)) &&
                (fStack_1010 <= auVar45._8_4_ &&
                (fStack_1000 <= auVar40._8_4_ && auVar24._8_4_ <= auVar28._8_4_));
        bVar6 = ((auVar49._12_4_ <= fStack_fcc && fStack_fdc <= auVar28._12_4_) &&
                (auVar26._12_4_ <= fStack_fbc && auVar24._12_4_ <= fStack_fec)) &&
                (fStack_100c <= auVar45._12_4_ &&
                (fStack_ffc <= auVar40._12_4_ && auVar24._12_4_ <= auVar28._12_4_));
        auVar49 = local_1028;
LAB_006851a0:
        auVar24._0_4_ = (uint)bVar4 * -0x80000000;
        auVar24._4_4_ = (uint)bVar5 * -0x80000000;
        auVar24._8_4_ = (uint)bVar3 * -0x80000000;
        auVar24._12_4_ = (uint)bVar6 * -0x80000000;
        uVar8 = movmskps((int)pauVar9,auVar24);
        if (uVar8 != 0) {
          uVar8 = uVar8 & 0xff;
          uVar12 = (ulong)pauVar11 & 0xfffffffffffffff0;
          lVar13 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          pauVar9 = *(undefined1 (**) [16])(uVar12 + lVar13 * 8);
          uVar8 = uVar8 - 1 & uVar8;
          pauVar11 = pauVar9;
          if (uVar8 != 0) {
            fVar25 = local_1058[lVar13];
            lVar13 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            pauVar11 = *(undefined1 (**) [16])(uVar12 + lVar13 * 8);
            fVar29 = local_1058[lVar13];
            uVar8 = uVar8 - 1 & uVar8;
            if (uVar8 == 0) {
              if ((uint)fVar25 < (uint)fVar29) {
                *(undefined1 (**) [16])*pauVar10 = pauVar11;
                *(float *)((long)*pauVar10 + 8) = fVar29;
                pauVar10 = pauVar10 + 1;
                pauVar11 = pauVar9;
              }
              else {
                *(undefined1 (**) [16])*pauVar10 = pauVar9;
                *(float *)((long)*pauVar10 + 8) = fVar25;
                pauVar9 = pauVar11;
                pauVar10 = pauVar10 + 1;
              }
            }
            else {
              auVar28._8_4_ = fVar25;
              auVar28._0_8_ = pauVar9;
              auVar28._12_4_ = 0;
              auVar33._8_4_ = fVar29;
              auVar33._0_8_ = pauVar11;
              auVar33._12_4_ = 0;
              lVar13 = 0;
              if (uVar8 != 0) {
                for (; (uVar8 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              uVar2 = *(undefined8 *)(uVar12 + lVar13 * 8);
              fVar30 = local_1058[lVar13];
              auVar27._8_4_ = fVar30;
              auVar27._0_8_ = uVar2;
              auVar27._12_4_ = 0;
              auVar16._8_4_ = -(uint)((int)fVar25 < (int)fVar29);
              uVar8 = uVar8 - 1 & uVar8;
              if (uVar8 == 0) {
                auVar16._4_4_ = auVar16._8_4_;
                auVar16._0_4_ = auVar16._8_4_;
                auVar16._12_4_ = auVar16._8_4_;
                auVar39._8_4_ = fVar29;
                auVar39._0_8_ = pauVar11;
                auVar39._12_4_ = 0;
                auVar40 = blendvps(auVar39,auVar28,auVar16);
                auVar24 = blendvps(auVar28,auVar33,auVar16);
                auVar17._8_4_ = -(uint)(auVar40._8_4_ < (int)fVar30);
                auVar17._4_4_ = auVar17._8_4_;
                auVar17._0_4_ = auVar17._8_4_;
                auVar17._12_4_ = auVar17._8_4_;
                auVar34._8_4_ = fVar30;
                auVar34._0_8_ = uVar2;
                auVar34._12_4_ = 0;
                auVar26 = blendvps(auVar34,auVar40,auVar17);
                auVar40 = blendvps(auVar40,auVar27,auVar17);
                auVar18._8_4_ = -(uint)(auVar24._8_4_ < auVar40._8_4_);
                auVar18._4_4_ = auVar18._8_4_;
                auVar18._0_4_ = auVar18._8_4_;
                auVar18._12_4_ = auVar18._8_4_;
                auVar28 = blendvps(auVar40,auVar24,auVar18);
                auVar24 = blendvps(auVar24,auVar40,auVar18);
                *pauVar10 = auVar24;
                pauVar10[1] = auVar28;
                pauVar9 = auVar26._0_8_;
                pauVar10 = pauVar10 + 2;
                pauVar11 = pauVar9;
              }
              else {
                lVar13 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                auVar19._4_4_ = auVar16._8_4_;
                auVar19._0_4_ = auVar16._8_4_;
                auVar19._8_4_ = auVar16._8_4_;
                auVar19._12_4_ = auVar16._8_4_;
                auVar40 = blendvps(auVar33,auVar28,auVar19);
                auVar24 = blendvps(auVar28,auVar33,auVar19);
                auVar44._8_4_ = local_1058[lVar13];
                auVar44._0_8_ = *(undefined8 *)(uVar12 + lVar13 * 8);
                auVar44._12_4_ = 0;
                auVar20._8_4_ = -(uint)((int)fVar30 < (int)local_1058[lVar13]);
                auVar20._4_4_ = auVar20._8_4_;
                auVar20._0_4_ = auVar20._8_4_;
                auVar20._12_4_ = auVar20._8_4_;
                auVar26 = blendvps(auVar44,auVar27,auVar20);
                auVar28 = blendvps(auVar27,auVar44,auVar20);
                auVar21._8_4_ = -(uint)(auVar24._8_4_ < auVar28._8_4_);
                auVar21._4_4_ = auVar21._8_4_;
                auVar21._0_4_ = auVar21._8_4_;
                auVar21._12_4_ = auVar21._8_4_;
                auVar45 = blendvps(auVar28,auVar24,auVar21);
                auVar24 = blendvps(auVar24,auVar28,auVar21);
                auVar22._8_4_ = -(uint)(auVar40._8_4_ < auVar26._8_4_);
                auVar22._4_4_ = auVar22._8_4_;
                auVar22._0_4_ = auVar22._8_4_;
                auVar22._12_4_ = auVar22._8_4_;
                auVar28 = blendvps(auVar26,auVar40,auVar22);
                auVar40 = blendvps(auVar40,auVar26,auVar22);
                auVar23._8_4_ = -(uint)(auVar40._8_4_ < auVar45._8_4_);
                auVar23._4_4_ = auVar23._8_4_;
                auVar23._0_4_ = auVar23._8_4_;
                auVar23._12_4_ = auVar23._8_4_;
                auVar26 = blendvps(auVar45,auVar40,auVar23);
                auVar40 = blendvps(auVar40,auVar45,auVar23);
                *pauVar10 = auVar24;
                pauVar10[1] = auVar40;
                pauVar10[2] = auVar26;
                pauVar9 = auVar28._0_8_;
                pauVar10 = pauVar10 + 3;
                pauVar11 = pauVar9;
              }
            }
          }
          goto LAB_00685130;
        }
        goto LAB_0068510b;
      }
      if (((ulong)pauVar11 & 8) == 0) {
        auVar24 = pauVar11[2];
        auVar28 = pauVar11[3];
        auVar26._4_4_ = fVar51;
        auVar26._0_4_ = fVar50;
        auVar26._8_4_ = fVar52;
        auVar26._12_4_ = fVar53;
        auVar26 = maxps(auVar26,auVar24);
        auVar26 = minps(auVar26,auVar28);
        fVar25 = auVar26._0_4_ - fVar50;
        fVar29 = auVar26._4_4_ - fVar51;
        fVar30 = auVar26._8_4_ - fVar52;
        fVar31 = auVar26._12_4_ - fVar53;
        auVar40._4_4_ = fVar55;
        auVar40._0_4_ = fVar54;
        auVar40._8_4_ = fVar56;
        auVar40._12_4_ = fVar57;
        auVar26 = maxps(auVar40,pauVar11[4]);
        auVar26 = minps(auVar26,pauVar11[5]);
        fVar32 = auVar26._0_4_ - fVar54;
        fVar35 = auVar26._4_4_ - fVar55;
        fVar36 = auVar26._8_4_ - fVar56;
        fVar37 = auVar26._12_4_ - fVar57;
        auVar45._4_4_ = fVar59;
        auVar45._0_4_ = fVar58;
        auVar45._8_4_ = fVar60;
        auVar45._12_4_ = fVar61;
        auVar26 = maxps(auVar45,pauVar11[6]);
        auVar26 = minps(auVar26,pauVar11[7]);
        fVar38 = auVar26._0_4_ - fVar58;
        fVar41 = auVar26._4_4_ - fVar59;
        fVar42 = auVar26._8_4_ - fVar60;
        fVar43 = auVar26._12_4_ - fVar61;
        local_1058[0] = fVar38 * fVar38 + fVar32 * fVar32 + fVar25 * fVar25;
        local_1058[1] = fVar41 * fVar41 + fVar35 * fVar35 + fVar29 * fVar29;
        local_1058[2] = fVar42 * fVar42 + fVar36 * fVar36 + fVar30 * fVar30;
        local_1058[3] = fVar43 * fVar43 + fVar37 * fVar37 + fVar31 * fVar31;
        bVar4 = auVar24._0_4_ <= auVar28._0_4_ && local_1058[0] <= fVar62;
        bVar5 = auVar24._4_4_ <= auVar28._4_4_ && local_1058[1] <= fVar63;
        bVar3 = auVar24._8_4_ <= auVar28._8_4_ && local_1058[2] <= fVar64;
        bVar6 = auVar24._12_4_ <= auVar28._12_4_ && local_1058[3] <= fVar65;
        goto LAB_006851a0;
      }
LAB_0068543f:
      local_1040 = (ulong)((uint)pauVar11 & 0xf) - 8;
      lVar13 = ((ulong)pauVar11 & 0xfffffffffffffff0) + 0x40;
      local_1030 = 0;
      for (local_1038 = 0; local_1038 != local_1040; local_1038 = local_1038 + 1) {
        bVar14 = 0;
        for (lVar15 = 0; (lVar15 != 4 && (*(int *)(lVar13 + lVar15 * 4) != -1)); lVar15 = lVar15 + 1
            ) {
          uVar8 = *(uint *)(lVar13 + -0x10 + lVar15 * 4);
          this = (context->scene->geometries).items[uVar8].ptr;
          context->geomID = uVar8;
          context->primID = *(uint *)(lVar13 + lVar15 * 4);
          bVar6 = Geometry::pointQuery(this,query,context);
          bVar14 = bVar14 | bVar6;
          fVar50 = local_f98;
          fVar51 = fStack_f94;
          fVar52 = fStack_f90;
          fVar53 = fStack_f8c;
          fVar54 = local_fa8;
          fVar55 = fStack_fa4;
          fVar56 = fStack_fa0;
          fVar57 = fStack_f9c;
          fVar58 = local_fb8;
          fVar59 = fStack_fb4;
          fVar60 = fStack_fb0;
          fVar61 = fStack_fac;
          fVar62 = local_f88;
          fVar63 = fStack_f84;
          fVar64 = fStack_f80;
          fVar65 = fStack_f7c;
        }
        local_1030 = CONCAT71((int7)(local_1030 >> 8),(byte)local_1030 | bVar14);
        lVar13 = lVar13 + 0x50;
        auVar49 = local_1028;
      }
    } while ((local_1030 & 1) == 0);
    auVar49 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    fVar65 = auVar49._0_4_;
    fVar62 = auVar49._4_4_;
    fVar63 = auVar49._8_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar49 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      auVar49 = dpps(auVar49,auVar49,0x7f);
    }
    bVar7 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }